

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudio_Release(FAudio *audio)

{
  long in_RDI;
  uint32_t refcount;
  undefined4 in_stack_fffffffffffffff0;
  uint32_t uVar1;
  
  *(int *)(in_RDI + 4) = *(int *)(in_RDI + 4) + -1;
  uVar1 = *(uint32_t *)(in_RDI + 4);
  if (*(int *)(in_RDI + 4) == 0) {
    FAudio_OPERATIONSET_ClearAll((FAudio *)CONCAT44(uVar1,in_stack_fffffffffffffff0));
    FAudio_StopEngine((FAudio *)0x124636);
    (**(code **)(in_RDI + 0xc0))(*(undefined8 *)(in_RDI + 0xa0));
    (**(code **)(in_RDI + 0xc0))(*(undefined8 *)(in_RDI + 0xa8));
    (**(code **)(in_RDI + 0xc0))(*(undefined8 *)(in_RDI + 0xb0));
    FAudio_PlatformDestroyMutex((FAudioMutex)0x124692);
    FAudio_PlatformDestroyMutex((FAudioMutex)0x1246a0);
    FAudio_PlatformDestroyMutex((FAudioMutex)0x1246ae);
    FAudio_PlatformDestroyMutex((FAudioMutex)0x1246bc);
    (**(code **)(in_RDI + 0xc0))(in_RDI);
    FAudio_PlatformRelease();
  }
  return uVar1;
}

Assistant:

uint32_t FAudio_Release(FAudio *audio)
{
	uint32_t refcount;
	LOG_API_ENTER(audio)
	audio->refcount -= 1;
	refcount = audio->refcount;
	if (audio->refcount == 0)
	{
		FAudio_OPERATIONSET_ClearAll(audio);
		FAudio_StopEngine(audio);
		audio->pFree(audio->decodeCache);
		audio->pFree(audio->resampleCache);
		audio->pFree(audio->effectChainCache);
		LOG_MUTEX_DESTROY(audio, audio->sourceLock)
		FAudio_PlatformDestroyMutex(audio->sourceLock);
		LOG_MUTEX_DESTROY(audio, audio->submixLock)
		FAudio_PlatformDestroyMutex(audio->submixLock);
		LOG_MUTEX_DESTROY(audio, audio->callbackLock)
		FAudio_PlatformDestroyMutex(audio->callbackLock);
		LOG_MUTEX_DESTROY(audio, audio->operationLock)
		FAudio_PlatformDestroyMutex(audio->operationLock);
		audio->pFree(audio);
		FAudio_PlatformRelease();
	}
	else
	{
		LOG_API_EXIT(audio)
	}
	return refcount;
}